

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

bool __thiscall
CommandLineParser::isOption(CommandLineParser *this,string *shortName,string *longName)

{
  __type _Var1;
  __type local_76;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *longName_local;
  string *shortName_local;
  CommandLineParser *this_local;
  
  local_28 = longName;
  longName_local = shortName;
  shortName_local = (string *)this;
  std::operator+(&local_48,"-",shortName);
  _Var1 = std::operator==(&this->m_option,&local_48);
  local_76 = true;
  if (!_Var1) {
    std::operator+(&local_68,"--",local_28);
    local_76 = std::operator==(&this->m_option,&local_68);
  }
  this_local._7_1_ = local_76;
  if (!_Var1) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool 
CommandLineParser::isOption( const std::string &shortName,
                             const std::string &longName )
{
  return (m_option == "-" + shortName)  ||
         (m_option == "--" + longName);
}